

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O0

int QGregorianCalendar::yearStartWeekDay(int year)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_EDI;
  int y;
  int in_stack_fffffffffffffff4;
  
  iVar3 = 0x321;
  if (in_EDI < 0) {
    iVar3 = 800;
  }
  iVar1 = QRoundingDown::qDiv<4u,int>(in_stack_fffffffffffffff4);
  iVar2 = QRoundingDown::qDiv<100u,int>(in_stack_fffffffffffffff4);
  iVar2 = ((in_EDI - iVar3) + iVar1) - iVar2;
  QRoundingDown::qDiv<400u,int>(iVar2);
  iVar3 = QRoundingDown::qMod<7u,int>(iVar2);
  return iVar3 + 1;
}

Assistant:

int QGregorianCalendar::yearStartWeekDay(int year)
{
    // Equivalent to weekDayOfJulian(julianForParts({year, 1, 1})
    const int y = year - (year < 0 ? 800 : 801);
    return qMod<7>(y + qDiv<4>(y) - qDiv<100>(y) + qDiv<400>(y)) + 1;
}